

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ParseOutput PVar1;
  App *pAVar2;
  Option *pOVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  WebServer *this_01;
  string_view args;
  bool websocket_server;
  bool http_server;
  bool autorestart;
  bool runremote;
  bool runterminal;
  BrokerKeeper broker;
  string mWebSocketArgs;
  string mHttpArgs;
  helicsCLI11App cmdLine;
  bool local_76d;
  bool local_76c;
  bool local_76b;
  char local_76a;
  char local_769;
  undefined1 local_768 [16];
  undefined1 local_758 [40];
  undefined1 local_730 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  int local_6f4;
  char **local_6f0;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_678;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  helicsCLI11App local_3d0;
  
  local_769 = '\0';
  local_76a = '\0';
  local_76b = false;
  local_76c = false;
  local_76d = false;
  local_730._24_8_ = &local_708;
  local_730._32_8_ = (__pthread_internal_list *)0x0;
  local_708._M_local_buf[0] = '\0';
  local_758._32_8_ = (long)local_730 + 8;
  local_730._0_8_ = 0;
  local_730[8] = '\0';
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4e8,"helics broker command line","");
  local_768._0_8_ = (WebServer *)local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"");
  helics::helicsCLI11App::helicsCLI11App(&local_3d0,&local_4e8,(string *)local_768);
  if ((WebServer *)local_768._0_8_ != (WebServer *)local_758) {
    operator_delete((void *)local_768._0_8_,local_758._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"term","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,
             "helics_broker term <broker args...> will start a broker and open a terminal control window for the broker run help in a terminal for more commands\n"
             ,"");
  pAVar2 = CLI::App::add_subcommand(&local_3d0.super_App,&local_508,&local_528);
  pAVar2->prefix_command_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  local_3f0._8_8_ = 0;
  local_3f0._M_unused._M_object = &local_769;
  local_3d8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:57:20)>
              ::_M_invoke;
  local_3e0 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:57:20)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar2->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar2->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_3f0);
  if (local_3e0 != (code *)0x0) {
    (*local_3e0)(&local_3f0,&local_3f0,__destroy_functor);
  }
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"remote","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,
             "helics_broker remote <connection args>  will start a terminal and connect to a remote HELICS rest API and allow sending API commands through a terminal"
             ,"");
  pAVar2 = CLI::App::add_subcommand(&local_3d0.super_App,&local_548,&local_568);
  pAVar2->prefix_command_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  local_410._8_8_ = 0;
  local_410._M_unused._M_object = &local_76a;
  local_3f8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:65:22)>
              ::_M_invoke;
  local_400 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:65:22)>
              ::_M_manager;
  CLI::std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar2->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar2->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_410);
  if (local_400 != (code *)0x0) {
    (*local_400)(&local_410,&local_410,__destroy_functor);
  }
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"--autorestart","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a8,
             "helics_broker --autorestart <broker args ...> will start a continually regenerating broker there is a 3 second countdown on broker completion to halt the program via ctrl-C\n"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_3d0.super_App,&local_588,&local_76b,&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"--http,--web","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5e8,"start a webserver to respond to http rest api requests","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_3d0.super_App,&local_5c8,&local_76c,&local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"--websocket","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_628,"start a websocket server to respond to api requests","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&local_3d0.super_App,&local_608,&local_76d,&local_628);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"--http_server_args","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_668,"command line arguments for the http server","");
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_3d0.super_App,&local_648,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_730 + 0x18),&local_668);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"HELICS_HTTP_ARGS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  local_688._M_allocated_capacity = (size_type)&local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"--websocket_server_args","")
  ;
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6a8,"command line arguments for the websocket server","");
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_3d0.super_App,(string *)&local_688,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_758 + 0x20),&local_6a8);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"HELICS_WEBSOCKET_ARGS","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar3->envname_,&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,(ulong)(local_6a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_allocated_capacity != &local_678) {
    operator_delete((void *)local_688._M_allocated_capacity,local_678._M_allocated_capacity + 1);
  }
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,
             "helics_broker <broker args ..> starts a broker with the given args and waits for it to complete\n"
             ,"");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_3d0.super_App.footer_,&local_498);
  local_438._M_unused._M_object = (void *)0x0;
  local_438._8_8_ = 0;
  local_420 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:94:18)>
              ::_M_invoke;
  local_428 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:94:18)>
              ::_M_manager;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator=(&local_3d0.super_App.footer_callback_,
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)&local_438);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_3d0.super_App.allow_extras_ = true;
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"");
  local_768._0_8_ = (WebServer *)local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"Read an ini file","");
  CLI::App::set_config(&local_3d0.super_App,&local_6c8,&local_6e8,(string *)local_768,false);
  if ((WebServer *)local_768._0_8_ != (WebServer *)local_758) {
    operator_delete((void *)local_768._0_8_,local_758._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  helics::helicsCLI11App::addSystemInfoCall(&local_3d0);
  PVar1 = helics::helicsCLI11App::helics_parse<int&,char**&>(&local_3d0,&local_6f4,&local_6f0);
  if (PVar1 != OK) {
    PVar1 = PVar1 >> 0x1f & PVar1;
    goto LAB_0018c2df;
  }
  if ((local_76c == false) && (local_76d != true)) {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (WebServer *)0x0;
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x100);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00543690;
    this_01 = (WebServer *)(this + 1);
    memset(&this[1]._M_use_count,0,0xe8);
    this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__WebServer_00543af0;
    this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    this[2]._M_use_count = 0;
    this[2]._M_weak_count = 0;
    this[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    this[3]._M_use_count = 0;
    this[3]._M_weak_count = 0;
    this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    this[4]._M_use_count = 0;
    this[4]._M_weak_count = 0;
    this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
    this[5]._M_use_count = 0;
    this[5]._M_weak_count = 0;
    this[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&this[6]._M_use_count = &this[7]._M_use_count;
    *(_Atomic_word **)&this[8]._M_use_count = &this[9]._M_use_count;
    *(_Atomic_word **)&this[10]._M_use_count = &this[0xb]._M_use_count;
    this[0xc]._M_use_count = 0xaa16;
    this[0xd]._vptr__Sp_counted_base = (_func_int **)(this + 0xe);
    *(undefined4 *)&this[0xf]._vptr__Sp_counted_base = 0xaa17;
    *(bool *)((long)&this[0xf]._vptr__Sp_counted_base + 4) = local_76c;
    if ((__pthread_internal_list *)local_730._32_8_ != (__pthread_internal_list *)0x0) {
      args._M_str = (char *)local_730._24_8_;
      args._M_len = local_730._32_8_;
      helics::apps::WebServer::processArgs(this_01,args);
    }
    *(bool *)((long)&this[0xf]._vptr__Sp_counted_base + 5) = local_76d;
    if (local_730._0_8_ != 0) {
      (*(this_01->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (this_01,local_730._0_8_,local_758._32_8_);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    local_768._0_8_ = this_01;
    local_768._8_8_ = this;
    (*(this_01->super_TypedBrokerServer)._vptr_TypedBrokerServer[2])(this_01,0,local_768);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_768._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_768._8_8_);
    }
  }
  if (local_769 == '\x01') {
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4b0,&local_3d0.remArgs);
    terminalFunction(&local_4b0);
    this_00 = &local_4b0;
LAB_0018c28f:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
  }
  else {
    if (local_76a == '\x01') {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4c8,&local_3d0.remArgs);
      remoteTerminalFunction(&local_4c8);
      this_00 = &local_4c8;
      goto LAB_0018c28f;
    }
    if (local_76b == true) {
      do {
        helics::BrokerApp::BrokerApp((BrokerApp *)local_768,&local_3d0.remArgs);
        helics::BrokerKeeper::~BrokerKeeper((BrokerKeeper *)local_768);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"broker restart in 3 seconds",0x1b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_768._0_8_ = (pointer)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)local_768);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"broker restart in 2 seconds",0x1b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_768._0_8_ = (pointer)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)local_768);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"broker restart in 1 seconds",0x1b);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_768._0_8_ = (WebServer *)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)local_768);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"broker restarting",0x11);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      } while( true );
    }
    helics::BrokerApp::BrokerApp((BrokerApp *)local_768,&local_3d0.remArgs);
    helics::BrokerKeeper::~BrokerKeeper((BrokerKeeper *)local_768);
  }
  PVar1 = OK;
  if (this_01 != (WebServer *)0x0) {
    (*(this_01->super_TypedBrokerServer)._vptr_TypedBrokerServer[3])(this_01);
  }
  helics::cleanupHelicsLibrary();
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
LAB_0018c2df:
  local_3d0.super_App._vptr_App = (_func_int **)&PTR__helicsCLI11App_00542d10;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d0.remArgs);
  CLI::std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&local_3d0.cbacks);
  CLI::App::~App(&local_3d0.super_App);
  if (local_758._32_8_ != (long)local_730 + 8U) {
    operator_delete((void *)local_758._32_8_,CONCAT71(local_730._9_7_,local_730[8]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._24_8_ != &local_708) {
    operator_delete((void *)local_730._24_8_,
                    CONCAT71(local_708._M_allocated_capacity._1_7_,local_708._M_local_buf[0]) + 1);
  }
  return PVar1;
}

Assistant:

int main(int argc, char* argv[])  // NOLINT
{
    int ret{0};
    bool runterminal{false};
    bool runremote{false};
    bool autorestart{false};

    bool http_server{false};
    bool websocket_server{false};
#ifdef HELICS_ENABLE_WEBSERVER
    std::string mHttpArgs;
    std::string mWebSocketArgs;
#endif
    helics::helicsCLI11App cmdLine("helics broker command line");
    auto* term =
        cmdLine
            .add_subcommand(
                "term",
                "helics_broker term <broker args...> will start a broker and open a terminal control window "
                "for the broker run help in a terminal for more commands\n")
            ->prefix_command();
    term->callback([&runterminal]() { runterminal = true; });

    auto* remote =
        cmdLine
            .add_subcommand(
                "remote",
                "helics_broker remote <connection args>  will start a terminal and connect to a remote HELICS rest API and allow sending API commands through a terminal")
            ->prefix_command();
    remote->callback([&runremote]() { runremote = true; });

    cmdLine.add_flag(
        "--autorestart",
        autorestart,
        "helics_broker --autorestart <broker args ...> will start a continually regenerating broker "
        "there is a 3 second countdown on broker completion to halt the program via ctrl-C\n");

    cmdLine.add_flag("--http,--web",
                     http_server,
                     "start a webserver to respond to http rest api requests");
    cmdLine.add_flag("--websocket",
                     websocket_server,
                     "start a websocket server to respond to api requests");
#ifdef HELICS_ENABLE_WEBSERVER
    cmdLine
        .add_option("--http_server_args", mHttpArgs, "command line arguments for the http server")
        ->envname("HELICS_HTTP_ARGS");
    cmdLine
        .add_option("--websocket_server_args",
                    mWebSocketArgs,
                    "command line arguments for the websocket server")
        ->envname("HELICS_WEBSOCKET_ARGS");
#endif

    cmdLine
        .footer(
            "helics_broker <broker args ..> starts a broker with the given args and waits for it to "
            "complete\n")
        ->footer([]() {
            [[maybe_unused]] helics::BrokerApp app{"-?"};
            return std::string{};
        });
    cmdLine.allow_extras();
    cmdLine.set_config();
    cmdLine.addSystemInfoCall();
    auto parseResult = cmdLine.helics_parse(argc, argv);
    if (parseResult != helics::helicsCLI11App::ParseOutput::OK) {
        return (static_cast<int>(parseResult) > 0) ? 0 : static_cast<int>(parseResult);
    }
#ifdef HELICS_ENABLE_WEBSERVER
    std::shared_ptr<helics::apps::WebServer> webserver;
    if (http_server || websocket_server) {
        webserver = std::make_shared<helics::apps::WebServer>();
        webserver->enableHttpServer(http_server);
        if (!mHttpArgs.empty()) {
            webserver->processArgs(mHttpArgs);
        }
        webserver->enableWebSocketServer(websocket_server);
        if (!mWebSocketArgs.empty()) {
            webserver->processArgs(mWebSocketArgs);
        }
        webserver->startServer(nullptr, webserver);
    }
#else
    if (http_server || websocket_server) {
        std::cout
            << "the http webserver and websocket server are not available in this build please recompile with webserver enabled to utilize "
            << std::endl;
    }
#endif
    try {
        if (runterminal) {
            terminalFunction(cmdLine.remainArgs());
        } else if (runremote) {
            remoteTerminalFunction(cmdLine.remainArgs());
        } else if (autorestart) {
            while (true) {
                // I am purposely making an object that creates and destroys itself on the same line
                // because this will run until termination so will take a while
                {
                    helics::BrokerKeeper brkapp{cmdLine.remainArgs()};
                }
                std::cout << "broker restart in 3 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 2 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 1 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restarting" << std::endl;
            }
        } else {
            helics::BrokerKeeper broker(cmdLine.remainArgs());
        }
    }
    catch (const std::invalid_argument& ia) {
        std::cerr << ia.what() << std::endl;
        ret = -2;
    }
    catch (const helics::HelicsException& he) {
        std::cerr << he.what() << std::endl;
        ret = -4;
    }
#ifdef HELICS_ENABLE_WEBSERVER
    if (webserver) {
        webserver->stopServer();
    }
#endif
    helics::cleanupHelicsLibrary();
    return ret;
}